

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O1

void __thiscall chrono::ChSolverADMM::Solve(ChSolverADMM *this)

{
  ChSystemDescriptor *in_RSI;
  
  Solve((ChSolverADMM *)&this[-1].acceleration,in_RSI);
  return;
}

Assistant:

double ChSolverADMM::Solve(ChSystemDescriptor& sysd) {

    switch (this->acceleration) {
    case AdmmAcceleration::BASIC:
        return _SolveBasic(sysd);
    case AdmmAcceleration::NESTEROV:
        return _SolveFast(sysd);
    default: 
        return _SolveBasic(sysd);
    }
}